

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O0

int check_bb_context(dmr_C *C,entrypoint *ep,basic_block *bb,int entry,int exit)

{
  int iVar1;
  int exit_local;
  int entry_local;
  basic_block *bb_local;
  entrypoint *ep_local;
  dmr_C *C_local;
  
  if (bb == (basic_block *)0x0) {
    C_local._4_4_ = 0;
  }
  else if (bb->context == entry) {
    C_local._4_4_ = 0;
  }
  else if (bb->context < 0) {
    bb->context = entry;
    iVar1 = context_increase(C,bb,entry);
    iVar1 = iVar1 + entry;
    if (iVar1 < 0) {
      C_local._4_4_ = imbalance(C,ep,bb,iVar1,exit,"unexpected unlock");
    }
    else {
      C_local._4_4_ = check_children(C,ep,bb,iVar1,exit);
    }
  }
  else {
    C_local._4_4_ = imbalance(C,ep,bb,entry,bb->context,"different lock contexts for basic block");
  }
  return C_local._4_4_;
}

Assistant:

static int check_bb_context(struct dmr_C *C, struct entrypoint *ep, struct basic_block *bb, int entry, int exit)
{
	if (!bb)
		return 0;
	if (bb->context == entry)
		return 0;

	/* Now that's not good.. */
	if (bb->context >= 0)
		return imbalance(C, ep, bb, entry, bb->context, "different lock contexts for basic block");

	bb->context = entry;
	entry += context_increase(C, bb, entry);
	if (entry < 0)
		return imbalance(C, ep, bb, entry, exit, "unexpected unlock");

	return check_children(C, ep, bb, entry, exit);
}